

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm.c
# Opt level: O0

double residual_norm_L2(double *approximation,uint dimension,double *space_coordinate,
                       double time_upper_boundary,_func_double_double_double *approximated)

{
  double dVar1;
  double dVar2;
  uint local_3c;
  double dStack_38;
  uint space_step;
  double norm;
  _func_double_double_double *approximated_local;
  double time_upper_boundary_local;
  double *space_coordinate_local;
  uint dimension_local;
  double *approximation_local;
  
  dStack_38 = 0.0;
  for (local_3c = 0; local_3c < dimension; local_3c = local_3c + 1) {
    dVar2 = approximation[local_3c];
    dVar1 = (*approximated)(space_coordinate[local_3c],time_upper_boundary);
    dVar2 = square(dVar2 - dVar1);
    dStack_38 = dVar2 + dStack_38;
  }
  dVar2 = sqrt(dStack_38 / (double)dimension);
  return dVar2;
}

Assistant:

double residual_norm_L2 (double const * approximation, 
                        unsigned dimension, 
                        double const * space_coordinate, 
                        double time_upper_boundary,
                        double (*approximated) (double, double)) {
  double norm = 0.;
  unsigned space_step;
  for (space_step = 0; space_step < dimension; ++space_step) {
    norm += square (approximation[space_step] - approximated (space_coordinate[space_step], time_upper_boundary));
  }
  norm = sqrt (norm / (double) dimension);
  return norm;
}